

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::FindNextProperty
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          ScriptContext *scriptContext,BigPropertyIndex *index,JavascriptString **propertyString,
          PropertyId *propertyId,PropertyAttributes *attributes,Type *type,
          DynamicType *typeToEnumerate,EnumeratorFlags flags,DynamicObject *instance,
          PropertyValueInfo *info)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  ushort local_52;
  BOOL result;
  PropertyIndex local;
  PropertyAttributes *attributes_local;
  PropertyId *propertyId_local;
  JavascriptString **propertyString_local;
  BigPropertyIndex *index_local;
  ScriptContext *scriptContext_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this_local;
  
  local_52 = (ushort)*index;
  _result = attributes;
  attributes_local = (PropertyAttributes *)propertyId;
  propertyId_local = (PropertyId *)propertyString;
  propertyString_local = (JavascriptString **)index;
  index_local = (BigPropertyIndex *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  if ((0xffff < (uint)*index) && (*index != -1)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2e6,
                                "(index <= Constants::UShortMaxValue || index == Constants::NoBigSlot)"
                                ,
                                "index <= Constants::UShortMaxValue || index == Constants::NoBigSlot"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  iVar3 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[10])
                    (this,index_local,&local_52,propertyId_local,attributes_local,_result,type,
                     typeToEnumerate,(uint)flags,instance,info);
  *(uint *)propertyString_local = (uint)local_52;
  return iVar3;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::FindNextProperty(ScriptContext* scriptContext, BigPropertyIndex& index, JavascriptString** propertyString,
        PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        PropertyIndex local = (PropertyIndex)index;
        Assert(index <= Constants::UShortMaxValue || index == Constants::NoBigSlot);
        BOOL result = this->FindNextProperty(scriptContext, local, propertyString, propertyId, attributes, type, typeToEnumerate, flags, instance, info);
        index = local;
        return result;
    }